

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_send(int s,void *buf,size_t len,int flags)

{
  int iVar1;
  nn_msghdr hdr;
  nn_iovec iov;
  int in_stack_00000064;
  nn_msghdr *in_stack_00000068;
  int in_stack_00000070;
  
  iVar1 = nn_sendmsg(in_stack_00000070,in_stack_00000068,in_stack_00000064);
  return iVar1;
}

Assistant:

int nn_send (int s, const void *buf, size_t len, int flags)
{
    struct nn_iovec iov;
    struct nn_msghdr hdr;

    iov.iov_base = (void*) buf;
    iov.iov_len = len;

    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    hdr.msg_control = NULL;
    hdr.msg_controllen = 0;

    return nn_sendmsg (s, &hdr, flags);
}